

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v9::detail::
         do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>
                   (appender out,big_decimal_fp *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  float_specs fVar1;
  char cVar2;
  byte bVar3;
  numpunct *pnVar4;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar5;
  appender aVar6;
  byte *pbVar7;
  long lVar8;
  size_t sVar9;
  byte *pbVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  int exp;
  char *significand;
  anon_class_40_8_dbbf3351 write;
  int num_zeros;
  undefined1 local_bf [3];
  uint local_bc;
  undefined1 local_b8 [8];
  int local_b0;
  undefined1 local_ac [4];
  undefined1 local_a8 [8];
  undefined1 local_a0 [16];
  int local_90;
  char cStack_8c;
  undefined3 uStack_8b;
  undefined8 local_88;
  digit_grouping<char> *local_80;
  digit_grouping<char> *local_78;
  uint *local_70;
  uint *local_68;
  char *local_60;
  digit_grouping<char> local_58;
  
  local_a8 = (undefined1  [8])f->significand;
  local_b0 = f->significand_size;
  local_bf[2] = 0x30;
  local_b8._4_4_ = fspecs._4_4_;
  local_bf[1] = fspecs._5_1_;
  fVar1 = fspecs;
  if (local_b0 < 0) goto LAB_0022ced1;
  uVar15 = (ulong)((local_b0 + 1) - (uint)(local_bf[1] == 0));
  cVar2 = '.';
  uVar13 = (uint)local_b8._4_4_ >> 0x11;
  local_b8 = (undefined1  [8])fspecs;
  if ((uVar13 & 1) != 0) {
    if (loc.locale_ == (void *)0x0) {
      std::locale::locale((locale *)local_a0);
    }
    else {
      std::locale::locale((locale *)local_a0,(locale *)loc.locale_);
    }
    pnVar4 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)local_a0);
    cVar2 = (**(code **)(*(long *)pnVar4 + 0x10))(pnVar4);
    std::locale::~locale((locale *)local_a0);
  }
  uVar13 = f->exponent;
  local_ac = (undefined1  [4])(local_b0 + uVar13);
  local_bf[0] = cVar2;
  if (local_b8[4] == '\x01') {
LAB_0022cb97:
    iVar12 = local_b0 + uVar13 + -1;
    if (((uint)local_b8._4_4_ >> 0x13 & 1) == 0) {
      uVar11 = 0;
      if (local_b0 == 1) {
        local_bf[0] = '\0';
      }
    }
    else {
      uVar11 = 0;
      if (0 < local_b8._0_4_ - local_b0) {
        uVar11 = (ulong)(uint)(local_b8._0_4_ - local_b0);
      }
      uVar15 = uVar15 + uVar11;
    }
    local_a0[0] = local_bf[1];
    local_a0._8_8_ = local_a8;
    cStack_8c = local_bf[0];
    local_90 = local_b0;
    local_88._0_5_ = CONCAT14('0',(int)uVar11);
    local_88 = (big_decimal_fp *)
               (CONCAT26(local_88._6_2_,
                         CONCAT15((((uint)local_b8._4_4_ >> 0x10 & 1) == 0) << 5,
                                  (undefined5)local_88)) | 0x450000000000);
    local_80 = (digit_grouping<char> *)CONCAT44(local_80._4_4_,iVar12);
    if (specs->width < 1) {
      if ((ulong)local_bf[1] != 0) {
        cVar2 = ""[local_bf[1]];
        if (*(ulong *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                             container + 0x18) <
            *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                     + 0x10) + 1U) {
          (*(code *)**(undefined8 **)
                      out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                    (out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
        }
        lVar8 = *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                container + 0x10);
        *(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                 0x10) = lVar8 + 1;
        *(char *)(*(long *)((long)out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                                  container + 8) + lVar8) = cVar2;
      }
      bVar5.container =
           (buffer<char> *)
           write_significand<fmt::v9::appender,char>
                     (out,(char *)local_a0._8_8_,local_90,1,cStack_8c);
      if (0 < (int)local_88) {
        bVar5.container =
             (buffer<char> *)
             fill_n<fmt::v9::appender,int,char>
                       ((appender)bVar5.container,(int)local_88,(char *)((long)&local_88 + 4));
      }
      cVar2 = local_88._5_1_;
      if ((bVar5.container)->capacity_ < (bVar5.container)->size_ + 1) {
        (**(bVar5.container)->_vptr_buffer)(bVar5.container);
      }
      sVar9 = (bVar5.container)->size_;
      (bVar5.container)->size_ = sVar9 + 1;
      (bVar5.container)->ptr_[sVar9] = cVar2;
      bVar5.container =
           (buffer<char> *)write_exponent<char,fmt::v9::appender>((int)local_80,bVar5.container);
    }
    else {
      if ((int)local_ac < 1) {
        iVar12 = 1 - (int)local_ac;
      }
      lVar8 = 2;
      if (99 < iVar12) {
        lVar8 = (ulong)(999 < iVar12) + 3;
      }
      sVar9 = uVar15 + (3 - (ulong)(local_bf[0] == '\0')) + lVar8;
      bVar5.container =
           (buffer<char> *)
           write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_&>
                     (out,specs,sVar9,sVar9,(anon_class_40_8_dbbf3351 *)local_a0);
    }
  }
  else {
    if (((ulong)local_b8 & 0xff00000000) == 0) {
      iVar12 = 0x10;
      if (0 < (int)local_b8._0_4_) {
        iVar12 = local_b8._0_4_;
      }
      if (((int)local_ac < -3) || (iVar12 < (int)local_ac)) goto LAB_0022cb97;
    }
    if ((int)uVar13 < 0) {
      if ((int)local_ac < 1) {
        iVar12 = -(int)local_ac;
        local_58.sep_.grouping._M_dataplus._M_p._0_4_ = iVar12;
        if (SBORROW4(local_b8._0_4_,iVar12) != local_b8._0_4_ + (int)local_ac < 0) {
          local_58.sep_.grouping._M_dataplus._M_p._0_4_ = local_b8._0_4_;
        }
        if ((int)local_b8._0_4_ < 0) {
          local_58.sep_.grouping._M_dataplus._M_p._0_4_ = iVar12;
        }
        if (local_b0 != 0) {
          local_58.sep_.grouping._M_dataplus._M_p._0_4_ = iVar12;
        }
        bVar3 = 1;
        if (local_b0 == 0 && (int)local_58.sep_.grouping._M_dataplus._M_p == 0) {
          bVar3 = (local_b8[6] & 8) >> 3;
        }
        local_bc = CONCAT31(local_bc._1_3_,bVar3);
        fVar1 = (float_specs)local_b8;
        if (-1 < (int)local_58.sep_.grouping._M_dataplus._M_p) {
          sVar9 = ((uint)bVar3 + (int)local_58.sep_.grouping._M_dataplus._M_p + 1) + uVar15;
          local_a0._0_8_ = local_bf + 1;
          local_a0._8_8_ = local_bf + 2;
          _local_90 = &local_bc;
          local_88 = (big_decimal_fp *)local_bf;
          local_80 = &local_58;
          local_78 = (digit_grouping<char> *)local_a8;
          local_70 = (uint *)&local_b0;
          aVar6 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_&>
                            (out,specs,sVar9,sVar9,(anon_class_56_7_162c6e41 *)local_a0);
          return (appender)
                 aVar6.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.
                 container;
        }
LAB_0022ced1:
        local_b8 = (undefined1  [8])fVar1;
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                    ,0x199,"negative value");
      }
      uVar13 = local_b8._0_4_ - local_b0 & (int)(local_b8._4_4_ << 0xc) >> 0x1f;
      local_bc = uVar13;
      digit_grouping<char>::digit_grouping
                (&local_58,loc,(bool)((byte)((uint)local_b8._4_4_ >> 0x11) & 1));
      pbVar7 = (byte *)CONCAT44(local_58.sep_.grouping._M_dataplus._M_p._4_4_,
                                (int)local_58.sep_.grouping._M_dataplus._M_p);
      pbVar10 = pbVar7 + local_58.sep_.grouping._M_string_length;
      iVar12 = 0;
      if ((int)uVar13 < 1) {
        uVar13 = 0;
      }
      sVar9 = uVar13 + uVar15;
      do {
        iVar14 = 0x7fffffff;
        if (local_58.sep_.thousands_sep != '\0') {
          if (pbVar7 == pbVar10) {
            uVar13 = (uint)(char)pbVar10[-1];
          }
          else {
            bVar3 = *pbVar7;
            if ((byte)(bVar3 + 0x81) < 0x82) goto LAB_0022cd9e;
            pbVar7 = pbVar7 + 1;
            uVar13 = (uint)bVar3;
          }
          iVar12 = iVar12 + uVar13;
          iVar14 = iVar12;
        }
LAB_0022cd9e:
        sVar9 = sVar9 + 1;
      } while (iVar14 < local_b0);
      local_a0._0_8_ = local_bf + 1;
      local_a0._8_8_ = local_a8;
      _local_90 = &local_b0;
      local_88 = (big_decimal_fp *)local_ac;
      local_80 = (digit_grouping<char> *)local_bf;
      local_70 = &local_bc;
      local_68 = (uint *)(local_bf + 2);
      local_78 = &local_58;
      bVar5.container =
           (buffer<char> *)
           write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_&>
                     (out,specs,sVar9,sVar9,(anon_class_64_8_e6ffa566 *)local_a0);
    }
    else {
      lVar8 = uVar13 + uVar15;
      local_bc = local_b8._0_4_ - (int)local_ac;
      if (((uint)local_b8._4_4_ >> 0x13 & 1) != 0) {
        if (local_b8[4] != '\x02' && (int)local_bc < 1) {
          local_bc = 1;
        }
        lVar8 = lVar8 + 1;
        if (0 < (long)(int)local_bc) {
          lVar8 = lVar8 + (int)local_bc;
        }
      }
      digit_grouping<char>::digit_grouping
                (&local_58,loc,(bool)((byte)((uint)local_b8._4_4_ >> 0x11) & 1));
      pbVar7 = (byte *)CONCAT44(local_58.sep_.grouping._M_dataplus._M_p._4_4_,
                                (int)local_58.sep_.grouping._M_dataplus._M_p);
      pbVar10 = pbVar7 + local_58.sep_.grouping._M_string_length;
      sVar9 = lVar8 - 1;
      iVar12 = 0;
      do {
        iVar14 = 0x7fffffff;
        if (local_58.sep_.thousands_sep != '\0') {
          if (pbVar7 == pbVar10) {
            uVar13 = (uint)(char)pbVar10[-1];
          }
          else {
            bVar3 = *pbVar7;
            if ((byte)(bVar3 + 0x81) < 0x82) goto LAB_0022cb2e;
            pbVar7 = pbVar7 + 1;
            uVar13 = (uint)bVar3;
          }
          iVar12 = iVar12 + uVar13;
          iVar14 = iVar12;
        }
LAB_0022cb2e:
        sVar9 = sVar9 + 1;
      } while (iVar14 < (int)local_ac);
      local_a0._0_8_ = local_bf + 1;
      local_a0._8_8_ = local_a8;
      _local_90 = &local_b0;
      local_78 = (digit_grouping<char> *)local_b8;
      local_70 = (uint *)local_bf;
      local_68 = &local_bc;
      local_60 = local_bf + 2;
      local_88 = f;
      local_80 = &local_58;
      bVar5.container =
           (buffer<char> *)
           write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::big_decimal_fp,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::big_decimal_fp_const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_&>
                     (out,specs,sVar9,sVar9,(anon_class_72_9_0c6a3a8a *)local_a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_58.sep_.grouping._M_dataplus._M_p._4_4_,
                    (int)local_58.sep_.grouping._M_dataplus._M_p) != &local_58.sep_.grouping.field_2
       ) {
      operator_delete((undefined1 *)
                      CONCAT44(local_58.sep_.grouping._M_dataplus._M_p._4_4_,
                               (int)local_58.sep_.grouping._M_dataplus._M_p),
                      local_58.sep_.grouping.field_2._M_allocated_capacity + 1);
    }
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar5.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}